

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

uint64_t __thiscall google::protobuf::internal::ThreadSafeArena::Reset(ThreadSafeArena *this)

{
  ulong uVar1;
  uint64_t uVar2;
  undefined1 *this_00;
  size_t offset;
  SizedPtr SVar3;
  
  uVar2 = SpaceAllocated(this);
  CleanupList(this);
  (this->first_arena_).cleanup_list_.limit_ = (CleanupNode *)0x0;
  (this->first_arena_).cleanup_list_.prefetch_ptr_ = (char *)0x0;
  (this->first_arena_).cleanup_list_.head_ = (Chunk *)0x0;
  (this->first_arena_).cleanup_list_.next_ = (CleanupNode *)0x0;
  SVar3 = Free(this);
  this_00 = (undefined1 *)SVar3.p;
  uVar1 = (this->alloc_policy_).policy_;
  if ((uVar1 & 0xfffffffffffffff9) == 0) {
    this_00 = (anonymous_namespace)::kSentryArenaBlock;
    offset = 0;
  }
  else {
    offset = (ulong)(7 < uVar1) << 5 | 0x10;
    ArenaBlock::ArenaBlock((ArenaBlock *)this_00,(ArenaBlock *)0x0,SVar3.n);
  }
  SerialArena::Init(&this->first_arena_,(ArenaBlock *)this_00,offset);
  Init(this);
  return uVar2;
}

Assistant:

uint64_t ThreadSafeArena::Reset() {
  const size_t space_allocated = SpaceAllocated();

  // Have to do this in a first pass, because some of the destructors might
  // refer to memory in other blocks.
  CleanupList();
  // Reset the first arena's cleanup list.
  first_arena_.cleanup_list_ = cleanup::ChunkList();

  // Discard all blocks except the first one. Whether it is user-provided or
  // allocated, always reuse the first block for the first arena.
  auto mem = Free();

  // Reset the first arena with the first block. This avoids redundant
  // free / allocation and re-allocating for AllocationPolicy. Adjust offset if
  // we need to preserve alloc_policy_.
  if (alloc_policy_.is_user_owned_initial_block() ||
      alloc_policy_.get() != nullptr) {
    size_t offset = alloc_policy_.get() == nullptr
                        ? kBlockHeaderSize
                        : kBlockHeaderSize + kAllocPolicySize;
    ABSL_ANNOTATE_MEMORY_IS_UNINITIALIZED(static_cast<char*>(mem.p) + offset,
                                          mem.n - offset);
    first_arena_.Init(new (mem.p) ArenaBlock{nullptr, mem.n}, offset);
  } else {
    first_arena_.Init(SentryArenaBlock(), 0);
  }

  // Since the first block and potential alloc_policy on the first block is
  // preserved, this can be initialized by Init().
  Init();

  return space_allocated;
}